

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap.cpp
# Opt level: O0

void Assimp::Bitmap::WriteHeader(Header *header,IOStream *file)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  size_t offset;
  uint8_t data [14];
  IOStream *file_local;
  Header *header_local;
  
  data._6_8_ = file;
  sVar1 = Copy<unsigned_short>((uint8_t *)((long)&offset + 2),&header->type);
  sVar2 = Copy<unsigned_int>((uint8_t *)((long)&offset + sVar1 + 2),&header->size);
  sVar3 = Copy<unsigned_short>((uint8_t *)((long)&offset + sVar2 + sVar1 + 2),&header->reserved1);
  lVar4 = sVar3 + sVar2 + sVar1;
  sVar1 = Copy<unsigned_short>((uint8_t *)((long)&offset + lVar4 + 2),&header->reserved2);
  Copy<unsigned_int>((uint8_t *)((long)&offset + sVar1 + lVar4 + 2),&header->offset);
  (**(code **)(*(long *)data._6_8_ + 0x18))(data._6_8_,(long)&offset + 2,0xe,1);
  return;
}

Assistant:

void Bitmap::WriteHeader(Header& header, IOStream* file) {
        uint8_t data[Header::header_size];

        std::size_t offset = 0;

        offset += Copy(&data[offset], header.type);
        offset += Copy(&data[offset], header.size);
        offset += Copy(&data[offset], header.reserved1);
        offset += Copy(&data[offset], header.reserved2);
                  Copy(&data[offset], header.offset);

        file->Write(data, Header::header_size, 1);
    }